

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall haVoc::Moveorder::next_phase(Moveorder *this)

{
  Phase PVar1;
  element_type *peVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  PVar1 = this->m_phase;
  if (BadQuiets < PVar1) {
    return;
  }
  if ((0xefU >> (PVar1 & 0x1f) & 1) == 0) {
    if ((0x210U >> (PVar1 & 0x1f) & 1) != 0) {
      peVar2 = (this->m_captures).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar4 = peVar2->m_end;
      if (uVar4 <= peVar2->m_start) {
        uVar5 = (ulong)(int)uVar4;
        peVar2->m_start = uVar4;
        lVar3 = (long)(peVar2->m_moves).
                      super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(peVar2->m_moves).
                      super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>.
                      _M_impl.super__Vector_impl_data._M_finish - lVar3 >> 3;
        if (uVar5 < uVar6) {
          do {
            if (-0x2711 < *(int *)(lVar3 + 4 + uVar5 * 8)) {
              uVar4 = uVar4 + 1;
              peVar2->m_end = uVar4;
            }
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        goto LAB_00119510;
      }
      if (PVar1 != GoodQuiets) {
        return;
      }
    }
    peVar2 = (this->m_quiets).super___shared_ptr<haVoc::ScoredMoves,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar4 = peVar2->m_end;
    if (peVar2->m_start < uVar4) {
      return;
    }
    uVar5 = (ulong)(int)uVar4;
    peVar2->m_start = uVar4;
    lVar3 = (long)(peVar2->m_moves).
                  super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar2->m_moves).
                  super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
                  super__Vector_impl_data._M_finish - lVar3 >> 3;
    if (uVar5 < uVar6) {
      do {
        if (-0x2711 < *(int *)(lVar3 + 4 + uVar5 * 8)) {
          uVar4 = uVar4 + 1;
          peVar2->m_end = uVar4;
        }
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
  }
LAB_00119510:
  this->m_phase = PVar1 + MateKiller1;
  return;
}

Assistant:

void Moveorder::next_phase() {
		if ((m_phase == HashMove) ||
				(m_phase == MateKiller1) ||
				(m_phase == MateKiller2) ||
				(m_phase == Killer1) ||
				(m_phase == Killer2) ||
				(m_phase == InitCaptures) ||
				(m_phase == InitQuiets))
			m_phase = Phase(m_phase + 1);
		else if ((m_phase == GoodCaptures || m_phase == BadCaptures) && m_captures->end())
		{
			m_captures->create_chunk(Score::ninf); // mark bad captures
			m_phase = Phase(m_phase + 1);
		}
		else if ((m_phase == GoodQuiets || m_phase == BadQuiets) && m_quiets->end())
		{
			m_quiets->create_chunk(Score::ninf); // mark bad quiet moves
			m_phase = Phase(m_phase + 1);
		}
	}